

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall ON_SubD::SharpEdgeCount(ON_SubD *this,ON_SubDEdgeSharpness *sharpness_range)

{
  bool bVar1;
  ON_SubDEdge *this_00;
  uint uVar2;
  ON_SubDEdgeSharpness OVar3;
  ON_SubDEdgeIterator eit;
  ON_SubDEdgeSharpness local_68;
  ON_SubDEdgeIterator local_60;
  
  *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = (ON_SubDEdgeSharpness)0x0;
  ON_SubDEdgeIterator::ON_SubDEdgeIterator(&local_60,this);
  local_60.m_edge_index = 0;
  local_60.m_e_current = local_60.m_e_first;
  uVar2 = 0;
  if (local_60.m_e_first != (ON_SubDEdge *)0x0) {
    this_00 = local_60.m_e_first;
    do {
      bVar1 = ON_SubDEdge::IsSharp(this_00);
      if (bVar1) {
        local_68 = ON_SubDEdge::Sharpness(this_00,false);
        OVar3 = ON_SubDEdgeSharpness::Union(sharpness_range,&local_68);
        *(ON_SubDEdgeSharpness *)sharpness_range->m_edge_sharpness = OVar3;
        uVar2 = uVar2 + 1;
      }
      this_00 = ON_SubDEdgeIterator::NextEdge(&local_60);
    } while (this_00 != (ON_SubDEdge *)0x0);
  }
  ON_SubDRef::~ON_SubDRef(&local_60.m_subd_ref);
  return uVar2;
}

Assistant:

unsigned int ON_SubD::SharpEdgeCount(ON_SubDEdgeSharpness& sharpness_range) const
{
  sharpness_range = ON_SubDEdgeSharpness::Smooth;
  unsigned int sharp_edge_count = 0;
  ON_SubDEdgeIterator eit = this->EdgeIterator();
  for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
  {
    if (e->IsSharp())
    {
      sharpness_range = ON_SubDEdgeSharpness::Union(sharpness_range, e->Sharpness(false));
      ++sharp_edge_count;      
    }
  }
  return sharp_edge_count;
}